

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

QString * llvmReadobjPath(QString *__return_storage_ptr__,Options *options)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QArrayDataPointer<char16_t> local_98;
  undefined1 local_80 [8];
  char16_t *local_78;
  ulong local_70;
  undefined1 local_68 [8];
  char16_t *local_60;
  ulong local_58;
  undefined1 local_50 [8];
  char16_t *local_48;
  ulong local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (options->ndkPath).d.ptr;
  local_40 = (options->ndkPath).d.size | 0x8000000000000000;
  local_38 = local_50;
  local_50[0] = 1;
  local_60 = (options->toolchainPrefix).d.ptr;
  local_58 = (options->toolchainPrefix).d.size | 0x8000000000000000;
  local_30 = local_68;
  local_68[0] = 1;
  local_78 = (options->ndkHost).d.ptr;
  local_70 = (options->ndkHost).d.size | 0x8000000000000000;
  local_28 = local_80;
  local_80[0] = 1;
  local_20 = 0;
  QVar4.m_size = (size_t)"%1/toolchains/%2/prebuilt/%3/bin/llvm-readobj";
  QVar4.field_0.m_data = &local_98;
  QtPrivate::argToQString(QVar4,0x400000000000002d,(ArgBase **)0x3);
  qVar3 = local_98.size;
  pcVar2 = local_98.ptr;
  pDVar1 = local_98.d;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = pcVar2;
  local_98.size = 0;
  (__return_storage_ptr__->d).size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString llvmReadobjPath(const Options &options)
{
    return execSuffixAppended("%1/toolchains/%2/prebuilt/%3/bin/llvm-readobj"_L1
                              .arg(options.ndkPath,
                                   options.toolchainPrefix,
                                   options.ndkHost));
}